

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O2

void __thiscall QDialog::setSizeGripEnabled(QDialog *this,bool enabled)

{
  long lVar1;
  bool bVar2;
  QWidget *pQVar3;
  int __sig;
  undefined7 in_register_00000031;
  long in_FS_OFFSET;
  QRect QVar4;
  QRect QVar5;
  QSize local_38;
  long local_30;
  
  __sig = (int)&local_38;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  *(bool *)(lVar1 + 0x2a0) = enabled;
  if ((int)CONCAT71(in_register_00000031,enabled) == 0) {
    if (*(long **)(lVar1 + 0x298) != (long *)0x0) {
      (**(code **)(**(long **)(lVar1 + 0x298) + 0x20))();
      *(undefined8 *)(lVar1 + 0x298) = 0;
    }
  }
  else if ((*(char *)(lVar1 + 0x278) == '\0') && (*(long *)(lVar1 + 0x298) == 0)) {
    pQVar3 = (QWidget *)operator_new(0x28);
    QSizeGrip::QSizeGrip((QSizeGrip *)pQVar3,&this->super_QWidget);
    *(QWidget **)(lVar1 + 0x298) = pQVar3;
    local_38 = (QSize)(**(code **)(*(long *)pQVar3 + 0x70))(pQVar3);
    QWidget::resize(pQVar3,&local_38);
    bVar2 = QWidget::isRightToLeft(&this->super_QWidget);
    pQVar3 = *(QWidget **)(lVar1 + 0x298);
    if (bVar2) {
      QVar4 = QWidget::rect(&this->super_QWidget);
      QVar5 = QWidget::rect(*(QWidget **)(lVar1 + 0x298));
      local_38 = (QSize)((ulong)(uint)(QVar4.x1.m_i.m_i - QVar5.x1.m_i) |
                        QVar4._8_8_ - (QVar5._8_8_ & 0xffffffff00000000) & 0xffffffff00000000);
    }
    else {
      QVar4 = QWidget::rect(&this->super_QWidget);
      QVar5 = QWidget::rect(*(QWidget **)(lVar1 + 0x298));
      local_38 = (QSize)((ulong)(uint)(QVar4.x2.m_i.m_i - QVar5.x2.m_i) |
                        QVar4._8_8_ - (QVar5._8_8_ & 0xffffffff00000000) & 0xffffffff00000000);
    }
    QWidget::move(pQVar3,(QPoint *)&local_38);
    QWidget::raise(*(QWidget **)(lVar1 + 0x298),__sig);
    QWidget::show(*(QWidget **)(lVar1 + 0x298));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDialog::setSizeGripEnabled(bool enabled)
{
#if !QT_CONFIG(sizegrip)
    Q_UNUSED(enabled);
#else
    Q_D(QDialog);
#if QT_CONFIG(sizegrip)
    d->sizeGripEnabled = enabled;
    if (enabled && d->doShowExtension)
        return;
#endif
    if (!enabled != !d->resizer) {
        if (enabled) {
            d->resizer = new QSizeGrip(this);
            // adjustSize() processes all events, which is suboptimal
            d->resizer->resize(d->resizer->sizeHint());
            if (isRightToLeft())
                d->resizer->move(rect().bottomLeft() -d->resizer->rect().bottomLeft());
            else
                d->resizer->move(rect().bottomRight() -d->resizer->rect().bottomRight());
            d->resizer->raise();
            d->resizer->show();
        } else {
            delete d->resizer;
            d->resizer = nullptr;
        }
    }
#endif // QT_CONFIG(sizegrip)
}